

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

int write_mtrk_length(smf_track_t *track)

{
  chunk_header_struct *mtrk_header;
  smf_track_t *track_local;
  
  if (track->file_buffer == (void *)0x0) {
    __assert_fail("track->file_buffer != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x163,"int write_mtrk_length(smf_track_t *)");
  }
  if (5 < track->file_buffer_length) {
    *(uint *)((long)track->file_buffer + 4) =
         (track->file_buffer_length + -8) * 0x1000000 |
         (track->file_buffer_length - 8U & 0xff00) << 8 |
         (track->file_buffer_length - 8U & 0xff0000) >> 8 | track->file_buffer_length - 8U >> 0x18;
    return 0;
  }
  __assert_fail("track->file_buffer_length >= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                ,0x164,"int write_mtrk_length(smf_track_t *)");
}

Assistant:

static int
write_mtrk_length(smf_track_t *track)
{
	struct chunk_header_struct *mtrk_header;

	assert(track->file_buffer != NULL);
	assert(track->file_buffer_length >= 6);

	mtrk_header = (struct chunk_header_struct *)track->file_buffer;
	mtrk_header->length = g_htonl(track->file_buffer_length - sizeof(struct chunk_header_struct));

	return (0);
}